

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O3

void __thiscall Tree::BuildVirtualFolder(Tree *this,cmXMLWriter *xml)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pTVar2;
  cmXMLWriter *this_00;
  char *__end;
  pointer this_01;
  string virtualFolders;
  string local_78;
  cmXMLWriter *local_58;
  string local_50;
  
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Option","");
  cmXMLWriter::StartElement(xml,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_58 = xml;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"CMake Files\\;","");
  this_01 = (this->folders).super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
            super__Vector_impl_data._M_start;
  pTVar2 = (this->folders).super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (this_01 != pTVar2) {
    do {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"","");
      BuildVirtualFolderImpl(this_01,&local_78,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      this_01 = this_01 + 1;
    } while (this_01 != pTVar2);
  }
  this_00 = local_58;
  cmXMLWriter::Attribute<std::__cxx11::string>(local_58,"virtualFolders",&local_78);
  cmXMLWriter::EndElement(this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Tree::BuildVirtualFolder(cmXMLWriter& xml) const
{
  xml.StartElement("Option");
  std::string virtualFolders = "CMake Files\\;";
  for (Tree const& folder : this->folders) {
    folder.BuildVirtualFolderImpl(virtualFolders, "");
  }
  xml.Attribute("virtualFolders", virtualFolders);
  xml.EndElement();
}